

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall
QGraphicsView::drawItems
          (QGraphicsView *this,QPainter *painter,int numItems,QGraphicsItem **items,
          QStyleOptionGraphicsItem *options)

{
  long lVar1;
  undefined1 *puVar2;
  QWidget *pQVar3;
  QPaintDevice *pQVar4;
  
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x498) != 0)) {
    puVar2 = (undefined1 *)QPainter::device();
    pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar4 = &pQVar3->super_QPaintDevice;
    if (pQVar3 == (QWidget *)0x0) {
      pQVar4 = (QPaintDevice *)0x0;
    }
    if ((QPaintDevice *)puVar2 == pQVar4) {
      pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    }
    else {
      pQVar3 = (QWidget *)0x0;
    }
    (**(code **)(**(long **)(lVar1 + 0x498) + 0xf8))
              (*(long **)(lVar1 + 0x498),painter,numItems,items,options,pQVar3);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }